

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.cpp
# Opt level: O0

void booster::stack_trace::write_symbols(void **addresses,int size,ostream *out)

{
  ulong uVar1;
  ostream *poVar2;
  ostream *in_RDX;
  int in_ESI;
  string tmp;
  int i;
  void *in_stack_000001b8;
  string local_40 [36];
  int local_1c;
  ostream *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  for (local_1c = 0; local_1c < local_c; local_1c = local_1c + 1) {
    get_symbol_abi_cxx11_(in_stack_000001b8);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = std::operator<<(local_18,local_40);
      std::operator<<(poVar2,'\n');
    }
    std::__cxx11::string::~string(local_40);
  }
  std::ostream::operator<<(local_18,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void write_symbols(void *const *addresses,int size,std::ostream &out)
        {
            for(int i=0;i<size;i++) {
                std::string tmp = get_symbol(addresses[i]);
                if(!tmp.empty()) {
                    out << tmp << '\n';
                }
            }
            out << std::flush;
        }